

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall dmlc::LogMessageFatal::LogMessageFatal(LogMessageFatal *this,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  int line_local;
  char *file_local;
  LogMessageFatal *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  DateLogger::DateLogger(&this->pretty_date_);
  poVar1 = std::operator<<((ostream *)this,"[");
  pcVar2 = DateLogger::HumanDate(&this->pretty_date_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

LogMessageFatal(const char *file, int line) {
    log_stream_ << "[" << pretty_date_.HumanDate() << "] " << file << ":"
                << line << ": ";
  }